

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.h
# Opt level: O0

void __thiscall
Index::Index(Index *this,Thread *thread,vector<Comment,_std::allocator<Comment>_> *comments)

{
  format_string_t<const_std::__cxx11::basic_string<char>_&> fmt;
  format_string_t<std::__cxx11::basic_string<char>_> fmt_00;
  format_string_t<std::__cxx11::basic_string<char>_> fmt_01;
  bool bVar1;
  pointer from;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  pointer args;
  pointer in_RDX;
  pointer in_RSI;
  set<Token,_std::less<Token>,_std::allocator<Token>_> *in_RDI;
  set<Token,_std::less<Token>,_std::allocator<Token>_> *in_stack_00000018;
  string_view in_stack_00000020;
  Comment *comment;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Comment,_std::allocator<Comment>_> *__range1;
  set<Token,_std::less<Token>,_std::allocator<Token>_> tokensfromThread;
  vector<LinkedToken,_std::allocator<LinkedToken>_> linksfromThread;
  vector<Comment,_std::allocator<Comment>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  size_t *__str;
  size_t in_stack_fffffffffffffe30;
  set<Token,_std::less<Token>,_std::allocator<Token>_> *to;
  set<Token,_std::less<Token>,_std::allocator<Token>_> *from_00;
  vector<LinkedToken,_std::allocator<LinkedToken>_> *to_00;
  Thread *in_stack_fffffffffffffe68;
  __normal_iterator<const_Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_> local_188;
  pointer local_180;
  string local_168 [16];
  Comment *in_stack_fffffffffffffea8;
  Index *in_stack_fffffffffffffeb0;
  char *local_148;
  vector<Comment,_std::allocator<Comment>_> local_140 [3];
  string local_f8 [32];
  char *local_d8;
  size_t local_d0 [6];
  char *local_a0;
  vector<LinkedToken,_std::allocator<LinkedToken>_> local_98;
  char *local_78;
  char **local_70;
  char *local_68;
  char **local_60;
  char *local_58;
  char **local_50;
  char *local_48;
  char **local_40;
  char *local_38;
  char **local_30;
  char *local_28;
  char **local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  to = in_RDI;
  local_98.super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>._M_impl.
  super__Vector_impl_data._M_finish = in_RDX;
  local_98.super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_RSI;
  std::set<Token,_std::less<Token>,_std::allocator<Token>_>::set
            ((set<Token,_std::less<Token>,_std::allocator<Token>_> *)0x1173e9);
  from_00 = in_RDI + 1;
  std::vector<LinkedToken,_std::allocator<LinkedToken>_>::vector
            ((vector<LinkedToken,_std::allocator<LinkedToken>_> *)0x1173fc);
  std::__cxx11::string::string
            ((string *)&in_RDI[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  local_70 = &local_a0;
  local_78 = "indexing new thread id {}";
  local_68 = "indexing new thread id {}";
  local_a0 = "indexing new thread id {}";
  to_00 = &local_98;
  local_60 = local_70;
  from = (pointer)std::char_traits<char>::length((char_type *)0x117477);
  (to_00->super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>)._M_impl.
  super__Vector_impl_data._M_start = from;
  local_18 = local_78;
  fmt.str_.size_ = in_stack_fffffffffffffe30;
  fmt.str_.data_ = in_stack_fffffffffffffe28;
  spdlog::info<std::__cxx11::string_const&>(fmt,in_stack_fffffffffffffe20);
  Thread::extractLinks(in_stack_fffffffffffffe68);
  local_50 = &local_d8;
  local_58 = "links: {}";
  local_48 = "links: {}";
  local_d8 = "links: {}";
  __str = local_d0;
  local_40 = local_50;
  this_00 = (basic_string_view<char,_std::char_traits<char>_> *)
            std::char_traits<char>::length((char_type *)0x117539);
  *__str = (size_t)this_00;
  local_10 = local_58;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,(char *)__str);
  ::str::join<std::vector<LinkedToken,std::allocator<LinkedToken>>>
            (in_stack_00000020,
             (vector<LinkedToken,_std::allocator<LinkedToken>_> *)in_stack_00000018);
  fmt_00.str_.size_ = (size_t)this_00;
  fmt_00.str_.data_ = (char *)__str;
  spdlog::info<std::__cxx11::string>(fmt_00,in_stack_fffffffffffffe20);
  std::__cxx11::string::~string(local_f8);
  moveInsert<LinkedToken>((vector<LinkedToken,_std::allocator<LinkedToken>_> *)from,to_00);
  Thread::extractTokens(in_stack_fffffffffffffe68);
  local_30 = &local_148;
  local_38 = "tokens: {}";
  local_28 = "tokens: {}";
  local_148 = "tokens: {}";
  this_01 = local_140;
  local_20 = local_30;
  args = (pointer)std::char_traits<char>::length((char_type *)0x11765a);
  (this_01->super__Vector_base<Comment,_std::allocator<Comment>_>)._M_impl.super__Vector_impl_data.
  _M_start = args;
  local_8 = local_38;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,(char *)__str);
  ::str::join<std::set<Token,std::less<Token>,std::allocator<Token>>>
            (in_stack_00000020,in_stack_00000018);
  fmt_01.str_.size_ = (size_t)this_00;
  fmt_01.str_.data_ = (char *)__str;
  spdlog::info<std::__cxx11::string>(fmt_01,&args->id);
  std::__cxx11::string::~string(local_168);
  moveInsert<Token>(from_00,to);
  local_180 = local_98.super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_188._M_current = (Comment *)std::vector<Comment,_std::allocator<Comment>_>::begin(this_01);
  std::vector<Comment,_std::allocator<Comment>_>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_>
                        *)args,(__normal_iterator<const_Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_>
                                *)this_01);
    if (!bVar1) break;
    __gnu_cxx::__normal_iterator<const_Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_>::
    operator*(&local_188);
    addToIndex(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    __gnu_cxx::__normal_iterator<const_Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_>::
    operator++(&local_188);
  }
  std::__cxx11::string::operator=
            ((string *)&to[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (string *)
             local_98.super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  std::set<Token,_std::less<Token>,_std::allocator<Token>_>::~set
            ((set<Token,_std::less<Token>,_std::allocator<Token>_> *)0x117816);
  std::vector<LinkedToken,_std::allocator<LinkedToken>_>::~vector
            ((vector<LinkedToken,_std::allocator<LinkedToken>_> *)this_00);
  return;
}

Assistant:

Index(const Thread& thread, const std::vector<Comment>& comments) {
			spdlog::info("indexing new thread id {}", thread.id);

			std::vector<LinkedToken> linksfromThread = thread.extractLinks();
			spdlog::info("links: {}", str::join("\n", linksfromThread));
			moveInsert(std::move(linksfromThread), links);

			std::set<Token> tokensfromThread = thread.extractTokens();
			spdlog::info("tokens: {}", str::join("\n", tokensfromThread));
			moveInsert(std::move(tokensfromThread), opTokens);

			for (const Comment& comment : comments) {
				addToIndex(comment);
			}

			threadId = thread.id;
		}